

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1932::~TestCase1932(TestCase1932 *this)

{
  TestCase1932 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Encoding, ListSize) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestListDefaults>();
  initTestMessage(root);

  auto lists = root.asReader().getLists();

  auto listSizes =
      lists.getList0().totalSize() +
      lists.getList1().totalSize() +
      lists.getList8().totalSize() +
      lists.getList16().totalSize() +
      lists.getList32().totalSize() +
      lists.getList64().totalSize() +
      lists.getListP().totalSize() +
      lists.getInt32ListList().totalSize() +
      lists.getTextListList().totalSize() +
      lists.getStructListList().totalSize();

  auto structSize = lists.totalSize();

  auto shallowSize = unbound(capnp::_::structSize<test::TestLists>().total() / WORDS);

  EXPECT_EQ(structSize.wordCount - shallowSize, listSizes.wordCount);
}